

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_transform.c
# Opt level: O3

void gdImageFlipVertical(gdImagePtr im)

{
  uchar uVar1;
  int **ppiVar2;
  int *piVar3;
  int *piVar4;
  uchar *puVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  iVar6 = im->sy;
  if (im->trueColor == 0) {
    if (1 < iVar6) {
      uVar8 = (ulong)(uint)im->sx;
      lVar7 = 0;
      do {
        if (0 < (int)uVar8) {
          lVar9 = 0;
          do {
            puVar5 = im->pixels[lVar7];
            uVar1 = puVar5[lVar9];
            puVar5[lVar9] = im->pixels[(int)(im->sy + ~(uint)lVar7)][lVar9];
            im->pixels[(int)(im->sy + ~(uint)lVar7)][lVar9] = uVar1;
            lVar9 = lVar9 + 1;
            uVar8 = (ulong)im->sx;
          } while (lVar9 < (long)uVar8);
          iVar6 = im->sy;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar6 / 2);
    }
  }
  else if (1 < iVar6) {
    ppiVar2 = im->tpixels;
    uVar8 = (ulong)(uint)im->sx;
    lVar7 = 0;
    do {
      if (0 < (int)uVar8) {
        piVar3 = ppiVar2[lVar7];
        piVar4 = ppiVar2[(int)(iVar6 + ~(uint)lVar7)];
        lVar9 = 0;
        do {
          iVar6 = piVar3[lVar9];
          piVar3[lVar9] = ppiVar2[(int)(im->sy + ~(uint)lVar7)][lVar9];
          piVar4[lVar9] = iVar6;
          lVar9 = lVar9 + 1;
          uVar8 = (ulong)im->sx;
        } while (lVar9 < (long)uVar8);
        iVar6 = im->sy;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar6 / 2);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageFlipVertical(gdImagePtr im)
{
	register int x, y;

	if (im->trueColor) {
		for (y = 0; y < im->sy / 2; y++) {
			int *row_dst = im->tpixels[y];
			int *row_src = im->tpixels[im->sy - 1 - y];
			for (x = 0; x < im->sx; x++) {
				register int p;
				p = row_dst[x];
				row_dst[x] = im->tpixels[im->sy - 1 - y][x];
				row_src[x] = p;
			}
		}
	} else {
		unsigned char p;
		for (y = 0; y < im->sy / 2; y++) {
			for (x = 0; x < im->sx; x++) {
				p = im->pixels[y][x];
				im->pixels[y][x] =	im->pixels[im->sy - 1 - y][x];
				im->pixels[im->sy - 1 - y][x] = p;
			}
		}
	}
	return;
}